

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_rkv.c
# Opt level: O1

MPP_RET hal_vp9d_rkv_flush(void *hal)

{
  long lVar1;
  
  lVar1 = *(long *)((long)hal + 0x40);
  if (((byte)hal_vp9d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp9d_rkv","(%d) enter\n","hal_vp9d_rkv_flush",0x28e);
  }
  *(undefined4 *)(lVar1 + 0xe8) = 0xffffffff;
  *(undefined4 *)(lVar1 + 0xf0) = 0xffffffff;
  if (((byte)hal_vp9d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp9d_rkv","(%d) leave\n","hal_vp9d_rkv_flush",0x293);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_vp9d_rkv_flush(void *hal)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx *)hal;
    Vp9dRkvCtx *hw_ctx = p_hal->hw_ctx;

    hal_vp9d_enter();

    hw_ctx->mv_base_addr = -1;
    hw_ctx->pre_mv_base_addr = -1;

    hal_vp9d_leave();

    return MPP_OK;
}